

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

double Executor::exp(double __x)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  int iVar15;
  undefined8 *puVar16;
  Var *pVVar17;
  void *extraout_RAX;
  void *extraout_RAX_00;
  long extraout_RAX_01;
  treeNode *ptVar18;
  undefined8 *in_RDI;
  _Alloc_hider _Var19;
  float fVar20;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x_00;
  double dVar21;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  float fVar22;
  string op;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0 [2];
  undefined4 in_stack_ffffffffffffff64;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (*(int *)((long)in_RDI + 0xc) == 2) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,in_RDI[6],in_RDI[7] + in_RDI[6]);
    pVVar17 = getVar(&local_50);
    __x = extraout_XMM0_Qa_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      __x = extraout_XMM0_Qa_01;
    }
    switch(pVVar17->kind) {
    case Integer:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).integer);
      dVar21 = extraout_XMM0_Qa_02;
      break;
    case Decmical:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).decmical);
      dVar21 = extraout_XMM0_Qa_05;
      break;
    case Boolean:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).boolean);
      dVar21 = extraout_XMM0_Qa_03;
      break;
    case Text:
      ptVar18 = (treeNode *)operator_new(0x58);
      pcVar4 = (pVVar17->text)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + (pVVar17->text)._M_string_length);
      treeNode::treeNode(ptVar18,&local_90);
      _Var19._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return extraout_XMM0_Qa_04;
      }
      goto LAB_00109eda;
    default:
      goto switchD_001097ad_default;
    }
  }
  else {
    if (*(int *)((long)in_RDI + 0xc) == 1) {
      puVar16 = (undefined8 *)operator_new(0x58);
      uVar13 = in_RDI[1];
      uVar5 = *(undefined4 *)(in_RDI + 2);
      uVar6 = *(undefined4 *)((long)in_RDI + 0x14);
      uVar7 = *(undefined4 *)(in_RDI + 3);
      uVar8 = *(undefined4 *)((long)in_RDI + 0x1c);
      uVar9 = *(undefined4 *)(in_RDI + 4);
      uVar10 = *(undefined4 *)((long)in_RDI + 0x24);
      uVar11 = *(undefined4 *)(in_RDI + 5);
      uVar12 = *(undefined4 *)((long)in_RDI + 0x2c);
      *puVar16 = *in_RDI;
      puVar16[1] = uVar13;
      *(undefined4 *)(puVar16 + 2) = uVar5;
      *(undefined4 *)((long)puVar16 + 0x14) = uVar6;
      *(undefined4 *)(puVar16 + 3) = uVar7;
      *(undefined4 *)((long)puVar16 + 0x1c) = uVar8;
      *(undefined4 *)(puVar16 + 4) = uVar9;
      *(undefined4 *)((long)puVar16 + 0x24) = uVar10;
      *(undefined4 *)(puVar16 + 5) = uVar11;
      *(undefined4 *)((long)puVar16 + 0x2c) = uVar12;
      puVar16[6] = puVar16 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar16 + 6),in_RDI[6],in_RDI[7] + in_RDI[6]);
      puVar16[10] = in_RDI[10];
      return extraout_XMM0_Qa;
    }
switchD_001097ad_default:
    if (*(int *)(in_RDI[2] + 0xc) == 0) {
      dVar21 = exp(__x);
      *(byte *)(extraout_RAX_01 + 0x54) = *(byte *)(extraout_RAX_01 + 0x54) ^ 1;
      return dVar21;
    }
    exp(__x);
    lVar3 = *(long *)(in_RDI[3] + 0x30);
    local_b0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&stack0xffffffffffffff60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,lVar3,*(long *)(in_RDI[3] + 0x38) + lVar3);
    exp(__x_00);
    iVar15 = std::__cxx11::string::compare((char *)local_b0);
    if (iVar15 == 0) {
      uVar1 = *(uint *)((long)extraout_RAX + 0x50);
      if (uVar1 == 3) {
        if (*(int *)((long)extraout_RAX_00 + 0x50) != 3) {
LAB_00109f00:
          reportError(in_stack_ffffffffffffff64);
        }
        ptVar18 = (treeNode *)operator_new(0x58);
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX + 0x30),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX_00 + 0x30));
        treeNode::treeNode(ptVar18,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      else {
        if ((1 < uVar1) || (uVar2 = *(uint *)((long)extraout_RAX_00 + 0x50), 1 < uVar2))
        goto LAB_00109f00;
        ptVar18 = (treeNode *)operator_new(0x58);
        if (uVar1 == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (uVar2 == 0) {
          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,fVar20 + fVar22);
      }
LAB_00109e96:
      if (*(void **)((long)extraout_RAX + 0x30) != (void *)((long)extraout_RAX + 0x40)) {
        operator_delete(*(void **)((long)extraout_RAX + 0x30));
      }
      operator_delete(extraout_RAX);
    }
    else {
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar15 == 0) {
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,fVar20 - fVar22);
        goto LAB_00109e96;
      }
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar15 == 0) {
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,fVar20 * fVar22);
        goto LAB_00109e96;
      }
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar15 == 0) {
        iVar15 = *(int *)((long)extraout_RAX_00 + 0x50);
        if (iVar15 == 0) {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
          fVar20 = (float)(int)fVar22;
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX_00 + 0x54);
          fVar22 = fVar20;
        }
        if ((fVar20 == 0.0) && (!NAN(fVar20))) goto LAB_00109f00;
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (iVar15 == 0) {
          fVar22 = (float)(int)fVar22;
        }
        treeNode::treeNode(ptVar18,fVar20 / fVar22);
        goto LAB_00109e96;
      }
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if ((iVar15 != 0) && (iVar15 = std::__cxx11::string::compare((char *)local_b0), iVar15 != 0))
      {
        if ((1 < *(uint *)((long)extraout_RAX + 0x50)) ||
           (1 < *(uint *)((long)extraout_RAX_00 + 0x50))) goto LAB_00109f00;
        iVar15 = std::__cxx11::string::compare((char *)local_b0);
        if (iVar15 == 0) {
          ptVar18 = (treeNode *)operator_new(0x58);
          if (*(int *)((long)extraout_RAX + 0x50) == 0) {
            fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
          }
          else {
            fVar20 = *(float *)((long)extraout_RAX + 0x54);
          }
          if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
            fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
          }
          else {
            fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
          }
          treeNode::treeNode(ptVar18,fVar22 < fVar20);
        }
        else {
          iVar15 = std::__cxx11::string::compare((char *)local_b0);
          if (iVar15 == 0) {
            ptVar18 = (treeNode *)operator_new(0x58);
            if (*(int *)((long)extraout_RAX + 0x50) == 0) {
              fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
            }
            else {
              fVar20 = *(float *)((long)extraout_RAX + 0x54);
            }
            if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
              fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
            }
            else {
              fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
            }
            treeNode::treeNode(ptVar18,fVar20 < fVar22);
          }
          else {
            iVar15 = std::__cxx11::string::compare((char *)local_b0);
            if (iVar15 == 0) {
              ptVar18 = (treeNode *)operator_new(0x58);
              if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
              }
              else {
                fVar20 = *(float *)((long)extraout_RAX + 0x54);
              }
              if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
              }
              else {
                fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
              }
              treeNode::treeNode(ptVar18,(bool)(-(fVar20 == fVar22) & 1));
            }
            else {
              iVar15 = std::__cxx11::string::compare((char *)local_b0);
              if (iVar15 == 0) {
                ptVar18 = (treeNode *)operator_new(0x58);
                if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                  fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                }
                else {
                  fVar20 = *(float *)((long)extraout_RAX + 0x54);
                }
                if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                  fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                }
                else {
                  fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                }
                treeNode::treeNode(ptVar18,(bool)(-(fVar20 != fVar22) & 1));
              }
              else {
                iVar15 = std::__cxx11::string::compare((char *)local_b0);
                if ((iVar15 == 0) ||
                   (iVar15 = std::__cxx11::string::compare((char *)local_b0), iVar15 == 0)) {
                  ptVar18 = (treeNode *)operator_new(0x58);
                  if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                    fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                  }
                  else {
                    fVar20 = *(float *)((long)extraout_RAX + 0x54);
                  }
                  if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                    fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                  }
                  else {
                    fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                  }
                  treeNode::treeNode(ptVar18,fVar20 <= fVar22);
                }
                else {
                  iVar15 = std::__cxx11::string::compare((char *)local_b0);
                  if ((iVar15 == 0) ||
                     (iVar15 = std::__cxx11::string::compare((char *)local_b0), iVar15 == 0)) {
                    ptVar18 = (treeNode *)operator_new(0x58);
                    if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                      fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                    }
                    else {
                      fVar20 = *(float *)((long)extraout_RAX + 0x54);
                    }
                    if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                      fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                    }
                    else {
                      fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                    }
                    treeNode::treeNode(ptVar18,fVar22 <= fVar20);
                  }
                }
              }
            }
          }
        }
        goto LAB_00109e96;
      }
      if ((*(int *)((long)extraout_RAX_00 + 0x50) != 2) &&
         (*(int *)((long)extraout_RAX + 0x50) != 2)) goto LAB_00109f00;
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar15 == 0) {
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(char *)((long)extraout_RAX + 0x54) == '\x01') {
          uVar14 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          uVar14 = false;
        }
        treeNode::treeNode(ptVar18,(bool)uVar14);
        goto LAB_00109e96;
      }
      iVar15 = std::__cxx11::string::compare((char *)local_b0);
      if (iVar15 == 0) {
        ptVar18 = (treeNode *)operator_new(0x58);
        uVar14 = true;
        if (*(char *)((long)extraout_RAX + 0x54) == '\0') {
          uVar14 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,(bool)uVar14);
        goto LAB_00109e96;
      }
      if (extraout_RAX != (void *)0x0) goto LAB_00109e96;
    }
    if (*(void **)((long)extraout_RAX_00 + 0x30) != (void *)((long)extraout_RAX_00 + 0x40)) {
      operator_delete(*(void **)((long)extraout_RAX_00 + 0x30));
    }
    operator_delete(extraout_RAX_00);
    _Var19._M_p = (pointer)local_b0[0];
    if (local_b0[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xffffffffffffff60) {
      return extraout_XMM0_Qa_06;
    }
LAB_00109eda:
    operator_delete(_Var19._M_p);
    dVar21 = extraout_XMM0_Qa_07;
  }
  return dVar21;
}

Assistant:

treeNode* exp(treeNode* node)
    {
        treeNode* ret = nullptr;
        if(node->kind.expKind==ExpKind::constExp)return new treeNode(*node);
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto retVar = getVar(node->text);
            switch(retVar->kind)
            {
                case AttrKind::Text:return new treeNode(retVar->text);
                case AttrKind::Integer:return new treeNode(retVar->value.integer);
                case AttrKind::Decmical:return new treeNode(retVar->value.decmical);
                case AttrKind::Boolean:return new treeNode(retVar->value.boolean);
            }
        }
        if(node->child[0]->kind.expKind==ExpKind::opExp)
        {
            ret = exp(node->child[1]);
            ret->attr.boolean=!ret->attr.boolean;
            return ret;
        }
        else 
        {
            auto left = exp(node->child[0]);
            string op = node->child[1]->text;
            auto right = exp(node->child[2]);
            if(op=="+")
            {
                if(left->attrKind==AttrKind::Text&&right->attrKind==AttrKind::Text)
                    ret = new treeNode(left->text + right->text);
                else if(checkDigit(left)&&checkDigit(right))
                    ret = new treeNode(GETDIGIT(left)+GETDIGIT(right));//string
                else
                    reportError(Error::errorType);
            } 
            else if(op=="-") ret = new treeNode(GETDIGIT(left)-GETDIGIT(right));
            else if(op=="*") ret = new treeNode(GETDIGIT(left)*GETDIGIT(right));
            else if(op=="/")
            {
                if(GETDIGIT(right)==0)
                    reportError(Error::divZero);
                else
                    ret = new treeNode(GETDIGIT(left)/GETDIGIT(right));
            }
            else if(op=="&&"||op=="||")
            {
                if(right->attrKind!=AttrKind::Boolean&&left->attrKind!=AttrKind::Boolean) 
                    reportError(Error::errorType);
                else if(op=="&&")ret = new treeNode(left->attr.boolean && right->attr.boolean);
                else if(op=="||")ret = new treeNode(left->attr.boolean || right->attr.boolean);
            }
            else
            {
                if(!(checkDigit(left)&&checkDigit(right)))reportError(Error::errorType);
                else if(op==">")ret = new treeNode(GETDIGIT(left)>GETDIGIT(right));
                else if(op=="<")ret = new treeNode(GETDIGIT(left)<GETDIGIT(right));
                else if(op=="==")ret = new treeNode(GETDIGIT(left)==GETDIGIT(right));
                else if(op=="!=")ret = new treeNode(GETDIGIT(left)!=GETDIGIT(right));
                else if(op=="<="||op=="=<")ret = new treeNode(GETDIGIT(left)<=GETDIGIT(right));
                else if(op==">="||op=="=>")ret = new treeNode(GETDIGIT(left)>=GETDIGIT(right));
            }
            delete left;
            delete right;
            return ret;
        }
    }